

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

InputDeclaration * __thiscall
soul::PoolAllocator::allocate<soul::heart::InputDeclaration,soul::CodeLocation&>
          (PoolAllocator *this,CodeLocation *args)

{
  PoolItem *pPVar1;
  CodeLocation local_28;
  
  pPVar1 = allocateSpaceForObject(this,0x78);
  local_28.sourceCode.object = (args->sourceCode).object;
  if (local_28.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_28.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_28.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_28.location.data = (args->location).data;
  heart::InputDeclaration::InputDeclaration((InputDeclaration *)&pPVar1->item,&local_28);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.sourceCode.object);
  pPVar1->destructor =
       allocate<soul::heart::InputDeclaration,_soul::CodeLocation_&>::anon_class_1_0_00000001::
       __invoke;
  return (InputDeclaration *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }